

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O0

ST2052_TextParser * __thiscall
AS_02::TimedText::ST2052_TextParser::OpenRead(ST2052_TextParser *this,string *filename)

{
  int iVar1;
  h__TextParser *phVar2;
  string *filename_local;
  ST2052_TextParser *this_local;
  Result_t *result;
  
  phVar2 = (h__TextParser *)operator_new(400);
  h__TextParser::h__TextParser(phVar2);
  ASDCP::mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser>::operator=
            ((mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser> *)
             &filename->_M_string_length,phVar2);
  phVar2 = ASDCP::mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser>::operator->
                     ((mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser> *)
                      &filename->_M_string_length);
  h__TextParser::OpenRead((h__TextParser *)this,(string *)phVar2);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar1 < 0) {
    ASDCP::mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser>::operator=
              ((mem_ptr<AS_02::TimedText::ST2052_TextParser::h__TextParser> *)
               &filename->_M_string_length,(h__TextParser *)0x0);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::ST2052_TextParser::OpenRead(const std::string& filename) const
{
  const_cast<AS_02::TimedText::ST2052_TextParser*>(this)->m_Parser = new h__TextParser;

  Result_t result = m_Parser->OpenRead(filename);

  if ( ASDCP_FAILURE(result) )
    const_cast<AS_02::TimedText::ST2052_TextParser*>(this)->m_Parser = 0;

  return result;
}